

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_pcm_rb_commit_read(ma_pcm_rb *pRB,ma_uint32 sizeInFrames,void *pBufferOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    if ((void *)((ulong)((pRB->rb).encodedReadOffset & 0x7fffffff) + (long)(pRB->rb).pBuffer) ==
        pBufferOut) {
      uVar2 = (pRB->rb).encodedReadOffset;
      uVar4 = (uVar2 & 0x7fffffff) +
              pRB->channels * sizeInFrames * *(int *)(&DAT_00338a90 + (ulong)pRB->format * 4);
      uVar1 = (pRB->rb).subbufferSizeInBytes;
      if (uVar4 <= uVar1) {
        uVar2 = uVar2 & 0x80000000;
        uVar3 = uVar2 | uVar4;
        if (uVar4 == uVar1) {
          uVar3 = uVar2 ^ 0x80000000;
        }
        LOCK();
        (pRB->rb).encodedReadOffset = uVar3;
        UNLOCK();
        return 0;
      }
    }
  }
  return -2;
}

Assistant:

MA_API ma_result ma_pcm_rb_commit_read(ma_pcm_rb* pRB, ma_uint32 sizeInFrames, void* pBufferOut)
{
    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_rb_commit_read(&pRB->rb, sizeInFrames * ma_pcm_rb_get_bpf(pRB), pBufferOut);
}